

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>::insert<kj::StringPtr,kj::StringPtr>
          (TreeIndex<kj::_::(anonymous_namespace)::StringCompare> *this,
          ArrayPtr<kj::StringPtr> table,size_t pos,StringPtr *params)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  StringPtr *pSVar6;
  size_t *in_R9;
  Maybe<unsigned_long> MVar7;
  StringPtr a;
  StringPtr b;
  Iterator iter;
  ArrayPtr<kj::StringPtr> table_local;
  SearchKey local_40;
  StringPtr *local_38;
  ArrayPtr<kj::StringPtr> *local_30;
  
  table_local.ptr = (StringPtr *)table.size_;
  local_38 = table.ptr;
  local_30 = &table_local;
  local_40._vptr_SearchKey = (_func_char_7_ **)&PTR_search_0021b938;
  pSVar6 = params;
  table_local.size_ = pos;
  _::BTreeImpl::insert(&iter,(BTreeImpl *)&(local_38->content).size_,&local_40);
  uVar4 = (ulong)iter.row;
  if (uVar4 == 0xe) {
    uVar4 = 0xe;
  }
  else {
    uVar1 = (iter.leaf)->rows[uVar4].i;
    if (uVar1 != 0) {
      uVar3 = uVar1 - 1;
      a.content.size_ = *in_R9;
      a.content.ptr = (char *)table_local.ptr[uVar3].content.size_;
      b.content.size_ = (size_t)pSVar6;
      b.content.ptr = (char *)in_R9[1];
      bVar2 = _::anon_unknown_0::StringCompare::matches
                        ((StringCompare *)table_local.ptr[uVar3].content.ptr,a,b);
      uVar4 = (ulong)iter.row;
      if (bVar2) {
        uVar1 = (iter.leaf)->rows[uVar4].i;
        *this = (TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)0x1;
        *(ulong *)(this + 8) = (ulong)(uVar1 - 1);
        aVar5 = extraout_RDX;
        goto LAB_0015b058;
      }
    }
  }
  memmove((iter.leaf)->rows + uVar4 + 1,(iter.leaf)->rows + uVar4,
          (ulong)((int)uVar4 + 1) * -4 + 0x38);
  (iter.leaf)->rows[uVar4].i = (int)params + 1;
  *this = (TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)0x0;
  aVar5 = extraout_RDX_00;
LAB_0015b058:
  MVar7.ptr.field_1.value = aVar5.value;
  MVar7.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar7.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }